

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

LogisticActivation * __thiscall
notch::core::LogisticActivation::tag_abi_cxx11_(LogisticActivation *this)

{
  ostream *poVar1;
  long in_RSI;
  ostringstream local_190 [8];
  ostringstream out;
  LogisticActivation *this_local;
  
  ::std::__cxx11::ostringstream::ostringstream(local_190);
  ::std::operator<<((ostream *)local_190,"logistic");
  if ((*(float *)(in_RSI + 8) != 1.0) || (NAN(*(float *)(in_RSI + 8)))) {
    poVar1 = ::std::operator<<((ostream *)local_190,"(");
    poVar1 = (ostream *)::std::ostream::operator<<(poVar1,*(float *)(in_RSI + 8));
    ::std::operator<<(poVar1,")");
  }
  ::std::__cxx11::ostringstream::str();
  ::std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

virtual std::string tag() const {
        std::ostringstream out;
        out << "logistic";
        if (slope != 1.0) {
            out << "(" << slope << ")";
        }
        return out.str();
    }